

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::ConstPubkeyProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type)

{
  char cVar1;
  byte bVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = *(char *)((long)this + 0x4d);
  if (cVar1 == '\x01') {
    s.m_data = (uchar *)((long)this + 0xc);
    sVar3 = 0x21;
    if ((*(byte *)((long)this + 0xc) & 0xfe) != 2) {
      bVar2 = *(byte *)((long)this + 0xc) - 4;
      if (bVar2 < 4) {
        sVar3 = (&DAT_0081cf98)[bVar2];
      }
      else {
        sVar3 = 0;
      }
    }
    s.m_size = sVar3;
    HexStr_abi_cxx11_(&local_40,s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,&local_40,2,0xffffffffffffffff);
  }
  else {
    s_00.m_data = (uchar *)((long)this + 0xc);
    sVar3 = 0x21;
    if ((*(byte *)((long)this + 0xc) & 0xfe) != 2) {
      bVar2 = *(byte *)((long)this + 0xc) - 4;
      if (bVar2 < 4) {
        sVar3 = (&DAT_0081cf98)[bVar2];
      }
      else {
        sVar3 = 0;
      }
    }
    s_00.m_size = sVar3;
    HexStr_abi_cxx11_(__return_storage_ptr__,s_00);
  }
  if ((cVar1 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type) const override { return m_xonly ? HexStr(m_pubkey).substr(2) : HexStr(m_pubkey); }